

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O2

cmDefinitions *
cmDefinitions::MakeClosure(cmDefinitions *__return_storage_ptr__,StackIter begin,StackIter end)

{
  bool bVar1;
  PointerType pcVar2;
  iterator iVar3;
  iterator iVar4;
  __node_base *p_Var5;
  key_type local_88;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  undefined;
  iterator local_40;
  
  local_40.Position = begin.Position;
  local_40.Tree = begin.Tree;
  (__return_storage_ptr__->Map)._M_h._M_buckets =
       &(__return_storage_ptr__->Map)._M_h._M_single_bucket;
  (__return_storage_ptr__->Map)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->Map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->Map)._M_h._M_element_count = 0;
  (__return_storage_ptr__->Map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->Map)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->Map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  undefined._M_h._M_buckets = &undefined._M_h._M_single_bucket;
  undefined._M_h._M_bucket_count = 1;
  undefined._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  undefined._M_h._M_element_count = 0;
  undefined._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  undefined._M_h._M_rehash_policy._M_next_resize = 0;
  undefined._M_h._M_single_bucket = (__node_base_ptr)0x0;
  while( true ) {
    bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_40,end);
    if (!bVar1) break;
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
    p_Var5 = &(pcVar2->Map)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      iVar3 = std::
              _Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)__return_storage_ptr__,(key_type *)(p_Var5 + 1));
      if (iVar3.super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>.
          _M_cur == (__node_type *)0x0) {
        local_88._M_len = *(size_t *)(p_Var5 + 3);
        local_88._M_str = *(char **)(p_Var5 + 4);
        iVar4 = std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&undefined._M_h,&local_88);
        if (iVar4.
            super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
            _M_cur == (__node_type *)0x0) {
          if (p_Var5[8]._M_nxt == (_Hash_node_base *)0x0) {
            local_88._M_len = *(size_t *)(p_Var5 + 3);
            local_88._M_str = *(char **)(p_Var5 + 4);
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&undefined._M_h,&local_88);
          }
          else {
            std::__detail::
            _Insert_base<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::insert((_Insert_base<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)__return_storage_ptr__,(value_type *)(p_Var5 + 1));
          }
        }
      }
    }
    cmLinkedTree<cmDefinitions>::iterator::operator++(&local_40);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&undefined._M_h);
  return __return_storage_ptr__;
}

Assistant:

cmDefinitions cmDefinitions::MakeClosure(StackIter begin, StackIter end)
{
  cmDefinitions closure;
  std::unordered_set<cm::string_view> undefined;
  for (StackIter it = begin; it != end; ++it) {
    // Consider local definitions.
    for (auto const& mi : it->Map) {
      // Use this key if it is not already set or unset.
      if (closure.Map.find(mi.first) == closure.Map.end() &&
          undefined.find(mi.first.view()) == undefined.end()) {
        if (mi.second.Value) {
          closure.Map.insert(mi);
        } else {
          undefined.emplace(mi.first.view());
        }
      }
    }
  }
  return closure;
}